

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O3

bool newReptContext(int32_t reptLineNo,char *body,size_t size)

{
  FileStackNode *pFVar1;
  uint32_t uVar2;
  FileStackNode *fileInfo;
  LexerState *pLVar3;
  int *piVar4;
  char *pcVar5;
  uint uVar6;
  
  pFVar1 = contextStack->fileInfo;
  uVar6 = 0;
  if (pFVar1->type == NODE_REPT) {
    uVar6 = *(uint *)&pFVar1[1].parent;
  }
  fileInfo = (FileStackNode *)malloc((ulong)(uVar6 + 1) * 4 + 0x30);
  if (fileInfo == (FileStackNode *)0x0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    error("Failed to alloc file info for REPT: %s\n",pcVar5);
  }
  else {
    fileInfo->type = NODE_REPT;
    *(uint *)&fileInfo[1].parent = uVar6 + 1;
    *(undefined4 *)((long)&fileInfo[1].parent + 4) = 1;
    if (uVar6 != 0) {
      memcpy(&fileInfo[1].lineNo,(void *)((long)&pFVar1[1].parent + 4),(ulong)uVar6 << 2);
    }
    newContext(fileInfo);
    contextStack->fileInfo->lineNo = reptLineNo;
    pLVar3 = lexer_OpenFileView("REPT",body,size,reptLineNo);
    contextStack->lexerState = pLVar3;
    if (pLVar3 == (LexerState *)0x0) {
      fatalerror("Failed to set up lexer for REPT block\n");
    }
    lexerStateEOL = pLVar3;
    uVar2 = macro_UseNewUniqueID();
    contextStack->uniqueID = uVar2;
  }
  return fileInfo != (FileStackNode *)0x0;
}

Assistant:

static bool newReptContext(int32_t reptLineNo, char *body, size_t size)
{
	uint32_t reptDepth = contextStack->fileInfo->type == NODE_REPT
				? ((struct FileStackReptNode *)contextStack->fileInfo)->reptDepth
				: 0;
	struct FileStackReptNode *fileInfo = (struct FileStackReptNode *)malloc(sizeof(*fileInfo)
			+ (reptDepth + 1) * sizeof(fileInfo->iters[0]));

	if (!fileInfo) {
		error("Failed to alloc file info for REPT: %s\n", strerror(errno));
		return false;
	}
	fileInfo->node.type = NODE_REPT;
	fileInfo->reptDepth = reptDepth + 1;
	fileInfo->iters[0] = 1;
	if (reptDepth)
		// Copy all parent iter counts
		memcpy(&fileInfo->iters[1],
		       ((struct FileStackReptNode *)contextStack->fileInfo)->iters,
		       reptDepth * sizeof(fileInfo->iters[0]));

	newContext((struct FileStackNode *)fileInfo);
	// Correct our line number, which currently points to the `ENDR` line
	contextStack->fileInfo->lineNo = reptLineNo;

	contextStack->lexerState = lexer_OpenFileView("REPT", body, size, reptLineNo);
	if (!contextStack->lexerState)
		fatalerror("Failed to set up lexer for REPT block\n");
	lexer_SetStateAtEOL(contextStack->lexerState);
	contextStack->uniqueID = macro_UseNewUniqueID();
	return true;
}